

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cobs.h
# Opt level: O2

size_t cobs_encode(uint8_t *input,size_t length,uint8_t *output)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  uint8_t uVar5;
  size_t sVar6;
  long lVar7;
  
  uVar5 = '\x01';
  sVar4 = 0;
  sVar6 = 0;
  sVar1 = 1;
  do {
    if (length == sVar4) {
      output[sVar6] = uVar5;
      return sVar1;
    }
    if (input[sVar4] == '\0') {
      lVar7 = 1;
      sVar3 = sVar1;
LAB_001023a7:
      output[sVar6] = uVar5;
      sVar2 = sVar1 + lVar7;
      uVar5 = '\x01';
      sVar6 = sVar3;
    }
    else {
      sVar2 = sVar1 + 1;
      output[sVar1] = input[sVar4];
      uVar5 = uVar5 + '\x01';
      if (uVar5 == 0xff) {
        uVar5 = 0xff;
        lVar7 = 2;
        sVar3 = sVar2;
        goto LAB_001023a7;
      }
    }
    sVar4 = sVar4 + 1;
    sVar1 = sVar2;
  } while( true );
}

Assistant:

size_t cobs_encode(const uint8_t *  input, size_t length, uint8_t *  output)
{
  size_t read_index = 0;
  size_t write_index = 1;
  size_t code_index = 0;
  uint8_t code = 1;

  while(read_index < length)
  {
    if(input[read_index] == 0)
    {
      output[code_index] = code;
      code = 1;
      code_index = write_index++;
      read_index++;
    }
    else
    {
      output[write_index++] = input[read_index++];
      code++;

      if(code == 0xFF)
      {
        output[code_index] = code;
        code = 1;
        code_index = write_index++;
      }
    }
  }

  output[code_index] = code;

  return write_index;
}